

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ScopedNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ScopedNameSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::NameSyntax&>
          (BumpAllocator *this,NameSyntax *args,Token *args_1,NameSyntax *args_2)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ScopedNameSyntax *pSVar6;
  
  pSVar6 = (ScopedNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ScopedNameSyntax *)this->endPtr < pSVar6 + 1) {
    pSVar6 = (ScopedNameSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pSVar6 + 1);
  }
  TVar2 = args_1->kind;
  uVar3 = args_1->field_0x2;
  NVar4.raw = (args_1->numFlags).raw;
  uVar5 = args_1->rawLen;
  pIVar1 = args_1->info;
  (pSVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = ScopedName;
  (pSVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar6->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = (SyntaxNode *)0x0
  ;
  (pSVar6->left).ptr = args;
  (pSVar6->separator).kind = TVar2;
  (pSVar6->separator).field_0x2 = uVar3;
  (pSVar6->separator).numFlags = (NumericTokenFlags)NVar4.raw;
  (pSVar6->separator).rawLen = uVar5;
  (pSVar6->separator).info = pIVar1;
  (pSVar6->right).ptr = args_2;
  (args->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pSVar6;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pSVar6;
  return pSVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }